

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

ptls_aead_context_t * create_retry_aead(quicly_context_t *ctx,uint32_t protocol_version,int is_enc)

{
  st_ptls_salt_t *psVar1;
  ptls_aead_context_t *ppVar2;
  uint32_t in_ESI;
  ptls_aead_context_t *aead;
  ptls_cipher_suite_t *algo;
  st_ptls_salt_t *salt;
  void *in_stack_00000028;
  int in_stack_00000034;
  ptls_aead_algorithm_t *in_stack_00000038;
  quicly_context_t *in_stack_ffffffffffffffe0;
  
  psVar1 = get_salt(in_ESI);
  if (psVar1 == (st_ptls_salt_t *)0x0) {
    __assert_fail("salt != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x22b,"ptls_aead_context_t *create_retry_aead(quicly_context_t *, uint32_t, int)"
                 );
  }
  get_aes128gcmsha256(in_stack_ffffffffffffffe0);
  ppVar2 = ptls_aead_new_direct(in_stack_00000038,in_stack_00000034,in_stack_00000028,ctx);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    return ppVar2;
  }
  __assert_fail("aead != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x22f,"ptls_aead_context_t *create_retry_aead(quicly_context_t *, uint32_t, int)");
}

Assistant:

static ptls_aead_context_t *create_retry_aead(quicly_context_t *ctx, uint32_t protocol_version, int is_enc)
{
    const struct st_ptls_salt_t *salt = get_salt(protocol_version);
    assert(salt != NULL);

    ptls_cipher_suite_t *algo = get_aes128gcmsha256(ctx);
    ptls_aead_context_t *aead = ptls_aead_new_direct(algo->aead, is_enc, salt->retry.key, salt->retry.iv);
    assert(aead != NULL);
    return aead;
}